

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

StructBuilder * __thiscall
capnp::_::OrphanBuilder::asStruct
          (StructBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize size)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  CapTableBuilder *capTable;
  BuilderArena *this_00;
  uint64_t uVar4;
  SegmentBuilder *this_01;
  SegmentBuilder *pSVar5;
  SegmentBuilder *pSVar6;
  undefined8 *puVar7;
  ushort uVar8;
  word *pwVar9;
  OrphanBuilder *pOVar10;
  OrphanBuilder *ref;
  StructSize SVar11;
  WirePointer *dst;
  uint uVar12;
  WirePointer *src;
  word *result_1;
  word *pwVar13;
  uint uVar14;
  ulong uVar15;
  AllocateResult AVar16;
  AllocateResult AVar17;
  uint local_68;
  
  pSVar6 = this->segment;
  AVar16.words = &this->tag;
  AVar16.segment = pSVar6;
  capTable = this->capTable;
  this_00 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
  uVar12 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  uVar8 = size.pointers;
  ref = this;
  if (id.value != 0 || uVar12 != 0) {
    if ((uVar12 & 3) == 2) {
      this_01 = BuilderArena::getSegment(this_00,id);
      uVar12 = (uint)(this->tag).content;
      pwVar9 = (this_01->super_SegmentReader).ptr.ptr;
      uVar15 = (ulong)(uVar12 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar9->content + uVar15);
      pOVar10 = (OrphanBuilder *)((long)&pwVar9[1].content + uVar15);
      if ((uVar12 & 4) == 0) {
        pwVar9 = &pOVar10->tag + ((int)(pOVar1->tag).content >> 2);
        pOVar10 = pOVar1;
      }
      else {
        this_01 = BuilderArena::getSegment
                            ((BuilderArena *)(this_01->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar9 = (word *)((long)&((this_01->super_SegmentReader).ptr.ptr)->content +
                         (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar9 = this->location;
      pOVar10 = this;
      this_01 = pSVar6;
    }
    if (this_01->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_01);
    }
    uVar4 = (pOVar10->tag).content;
    if ((uVar4 & 3) == 0) {
      uVar2 = *(ushort *)((long)&(pOVar10->tag).content + 4);
      uVar3 = *(ushort *)((long)&(pOVar10->tag).content + 6);
      src = (WirePointer *)(pwVar9 + uVar2);
      SVar11.pointers = 0;
      SVar11.data = uVar2;
      if (uVar3 < uVar8 || uVar2 < size.data) {
        if (uVar2 <= size.data) {
          SVar11 = size;
        }
        uVar12 = (uint)size >> 0x10;
        if (uVar8 < uVar3) {
          uVar12 = (uint)uVar3;
        }
        if ((((this->tag).content & 3) == 2) &&
           (pSVar5 = BuilderArena::getSegment
                               ((BuilderArena *)(pSVar6->super_SegmentReader).arena,
                                (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
           pSVar5->readOnly == false)) {
          uVar14 = (uint)(this->tag).content;
          puVar7 = (undefined8 *)
                   ((long)&((pSVar5->super_SegmentReader).ptr.ptr)->content +
                   (ulong)(uVar14 & 0xfffffff8));
          if ((uVar14 & 4) == 0) {
            *puVar7 = 0;
          }
          else {
            *puVar7 = 0;
            puVar7[1] = 0;
          }
        }
        uVar14 = uVar12 + ((uint)SVar11 & 0xffff);
        (this->tag).content = 0;
        if (this_00 == (BuilderArena *)0x0) {
          if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
            WireHelpers::zeroObject(pSVar6,capTable,(WirePointer *)this);
          }
          if (uVar14 == 0) {
            *(undefined4 *)&(this->tag).content = 0xfffffffc;
          }
          else {
            pwVar13 = pSVar6->pos;
            if ((long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                      ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pwVar13)) >> 3 <
                (long)(ulong)uVar14) {
              pwVar13 = (word *)0x0;
            }
            else {
              pSVar6->pos = pwVar13 + uVar14;
            }
            AVar16.words = pwVar13;
            if (pwVar13 == (word *)0x0) {
              AVar16 = BuilderArena::allocate
                                 ((BuilderArena *)(pSVar6->super_SegmentReader).arena,uVar14 + 1);
              ref = (OrphanBuilder *)AVar16.words;
              pSVar6 = AVar16.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar16.words - *(int *)&(pSVar6->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar6->super_SegmentReader).id.value;
              *(undefined4 *)&(ref->tag).content = 0;
              AVar16.words = (word *)&ref->segment;
              AVar16.segment = pSVar6;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar13 - (long)this) >> 1) & 0xfffffffc) - 4;
            }
          }
        }
        else {
          AVar16 = BuilderArena::allocate(this_00,uVar14);
          *(undefined4 *)&(this->tag).content = 0xfffffffc;
        }
        pwVar13 = AVar16.words;
        pSVar6 = AVar16.segment;
        *(StructDataWordCount *)((long)&(ref->tag).content + 4) = SVar11.data;
        *(StructPointerCount *)((long)&(ref->tag).content + 6) = (StructPointerCount)uVar12;
        if (uVar2 != 0) {
          memcpy(pwVar13,pwVar9,(ulong)uVar2 << 3);
        }
        uVar15 = (ulong)uVar3;
        dst = (WirePointer *)(pwVar13 + ((uint)SVar11 & 0xffff));
        if (uVar3 != 0) {
          do {
            WireHelpers::transferPointer(pSVar6,dst,this_01,src);
            src = src + 1;
            uVar15 = uVar15 - 1;
            dst = dst + 1;
          } while (uVar15 != 0);
        }
        local_68 = (uint)uVar2;
        if (uVar3 + local_68 != 0) {
          memset(pwVar9,0,(ulong)((uVar3 + local_68) * 8));
        }
        __return_storage_ptr__->segment = pSVar6;
        __return_storage_ptr__->capTable = capTable;
        __return_storage_ptr__->data = pwVar13;
        __return_storage_ptr__->pointers = (WirePointer *)(pwVar13 + ((uint)SVar11 & 0xffff));
        __return_storage_ptr__->dataSize = ((uint)SVar11 & 0xffff) << 6;
        __return_storage_ptr__->pointerCount = (StructPointerCount)uVar12;
      }
      else {
        __return_storage_ptr__->segment = this_01;
        __return_storage_ptr__->capTable = capTable;
        __return_storage_ptr__->data = pwVar9;
        __return_storage_ptr__->pointers = src;
        __return_storage_ptr__->dataSize = (uint)uVar2 << 6;
        __return_storage_ptr__->pointerCount = uVar3;
      }
    }
    else {
      asStruct();
    }
    if ((uVar4 & 3) == 0) goto LAB_001863da;
  }
  uVar12 = ((uint)size >> 0x10) + ((uint)size & 0xffff);
  if (this_00 == (BuilderArena *)0x0) {
    if (*(int *)((long)&(ref->tag).content + 4) != 0 || (int)(ref->tag).content != 0) {
      WireHelpers::zeroObject(pSVar6,capTable,(WirePointer *)ref);
    }
    AVar17.words = &ref->tag;
    AVar17.segment = pSVar6;
    if (uVar12 == 0) {
      *(undefined4 *)&(ref->tag).content = 0xfffffffc;
    }
    else {
      pwVar9 = pSVar6->pos;
      if ((long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pwVar9)) >> 3 <
          (long)(ulong)uVar12) {
        pwVar9 = (word *)0x0;
      }
      else {
        pSVar6->pos = pwVar9 + uVar12;
      }
      AVar17.words = pwVar9;
      if (pwVar9 == (word *)0x0) {
        AVar16 = BuilderArena::allocate
                           ((BuilderArena *)(pSVar6->super_SegmentReader).arena,uVar12 + 1);
        pOVar10 = (OrphanBuilder *)AVar16.words;
        pSVar6 = AVar16.segment;
        *(uint *)&(ref->tag).content =
             (int)AVar16.words - *(int *)&(pSVar6->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        *(uint *)((long)&(ref->tag).content + 4) = (pSVar6->super_SegmentReader).id.value;
        *(undefined4 *)&(pOVar10->tag).content = 0;
        AVar17.words = (word *)&pOVar10->segment;
        AVar17.segment = pSVar6;
        ref = pOVar10;
      }
      else {
        *(uint *)&(ref->tag).content =
             ((uint)((ulong)((long)pwVar9 - (long)ref) >> 1) & 0xfffffffc) - 4;
      }
    }
  }
  else {
    AVar17 = BuilderArena::allocate(this_00,uVar12);
    *(undefined4 *)&(ref->tag).content = 0xfffffffc;
  }
  *(StructSize *)((long)&(ref->tag).content + 4) = size;
  __return_storage_ptr__->segment = AVar17.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->data = AVar17.words;
  __return_storage_ptr__->pointers = (WirePointer *)(AVar17.words + ((uint)size & 0xffff));
  __return_storage_ptr__->dataSize = ((uint)size & 0xffff) << 6;
  __return_storage_ptr__->pointerCount = uVar8;
LAB_001863da:
  this->location = (word *)__return_storage_ptr__->data;
  return __return_storage_ptr__;
}

Assistant:

StructBuilder OrphanBuilder::asStruct(StructSize size) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  StructBuilder result = WireHelpers::getWritableStructPointer(
      tagAsPtr(), location, segment, capTable, size, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = reinterpret_cast<word*>(result.data);

  return result;
}